

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int luaG_traceexec(lua_State *L,Instruction *pc)

{
  byte *pbVar1;
  int *piVar2;
  uint uVar3;
  CallInfo *pCVar4;
  Proto *f;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int pc_00;
  
  pCVar4 = L->ci;
  uVar3 = L->hookmask;
  if ((uVar3 & 0xc) == 0) {
    (pCVar4->u).l.trap = 0;
    return 0;
  }
  f = *(Proto **)((((pCVar4->func).p)->val).value_.f + 0x18);
  (pCVar4->u).l.savedpc = pc + 1;
  if ((uVar3 & 8) == 0) {
LAB_0010a18d:
    if ((uVar3 & 4) == 0) {
      return 1;
    }
    bVar5 = false;
  }
  else {
    piVar2 = &L->hookcount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 != 0) goto LAB_0010a18d;
    L->hookcount = L->basehookcount;
    bVar5 = true;
  }
  if ((pCVar4->callstatus >> 0x17 & 1) != 0) {
    pCVar4->callstatus = pCVar4->callstatus & 0xff7fffff;
    return 1;
  }
  iVar6 = luaP_isIT(*(Instruction *)((pCVar4->u).c.k + -4));
  if (iVar6 == 0) {
    L->top = pCVar4->top;
  }
  if (bVar5) {
    luaD_hook(L,3,-1,0,0);
  }
  if ((uVar3 & 4) == 0) goto LAB_0010a2ad;
  iVar6 = 0;
  if (L->oldpc < f->sizecode) {
    iVar6 = L->oldpc;
  }
  iVar7 = (int)((ulong)((long)(pc + 1) - (long)f->code) >> 2);
  pc_00 = iVar7 + -1;
  if (pc_00 <= iVar6) goto LAB_0010a289;
  if (f->lineinfo != (ls_byte *)0x0) {
    if (pc_00 - iVar6 < 0x40) {
      iVar8 = 0;
      lVar9 = 1;
      do {
        iVar10 = (int)f->lineinfo[lVar9 + iVar6];
        if (iVar10 == -0x80) goto LAB_0010a26e;
        iVar8 = iVar8 + iVar10;
        lVar9 = lVar9 + 1;
      } while (iVar7 - iVar6 != (int)lVar9);
      if (iVar8 != 0) goto LAB_0010a289;
    }
    else {
LAB_0010a26e:
      iVar6 = luaG_getfuncline(f,iVar6);
      iVar7 = luaG_getfuncline(f,pc_00);
      if (iVar6 != iVar7) {
LAB_0010a289:
        iVar6 = luaG_getfuncline(f,pc_00);
        luaD_hook(L,2,iVar6,0,0);
      }
    }
  }
  L->oldpc = pc_00;
LAB_0010a2ad:
  if (L->status != '\x01') {
    return 1;
  }
  if (bVar5) {
    L->hookcount = 1;
  }
  pbVar1 = (byte *)((long)&pCVar4->callstatus + 2);
  *pbVar1 = *pbVar1 | 0x80;
  luaD_throw(L,'\x01');
}

Assistant:

int luaG_traceexec (lua_State *L, const Instruction *pc) {
  CallInfo *ci = L->ci;
  lu_byte mask = cast_byte(L->hookmask);
  const Proto *p = ci_func(ci)->p;
  int counthook;
  if (!(mask & (LUA_MASKLINE | LUA_MASKCOUNT))) {  /* no hooks? */
    ci->u.l.trap = 0;  /* don't need to stop again */
    return 0;  /* turn off 'trap' */
  }
  pc++;  /* reference is always next instruction */
  ci->u.l.savedpc = pc;  /* save 'pc' */
  counthook = (mask & LUA_MASKCOUNT) && (--L->hookcount == 0);
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return 1;  /* no line hook and count != 0; nothing to be done now */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* hook yielded last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return 1;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (!luaP_isIT(*(ci->u.l.savedpc - 1)))  /* top not being used? */
    L->top.p = ci->top.p;  /* correct top */
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1, 0, 0);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    /* 'L->oldpc' may be invalid; use zero in this case */
    int oldpc = (L->oldpc < p->sizecode) ? L->oldpc : 0;
    int npci = pcRel(pc, p);
    if (npci <= oldpc ||  /* call hook when jump back (loop), */
        changedline(p, oldpc, npci)) {  /* or when enter new line */
      int newline = luaG_getfuncline(p, npci);
      luaD_hook(L, LUA_HOOKLINE, newline, 0, 0);  /* call line hook */
    }
    L->oldpc = npci;  /* 'pc' of last call to line hook */
  }
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    luaD_throw(L, LUA_YIELD);
  }
  return 1;  /* keep 'trap' on */
}